

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void duckdb_je_stats_print(write_cb_t *write_cb,void *cbopaque,char *opts)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  _Bool destroyed;
  bool bVar5;
  _Bool large;
  _Bool bins;
  _Bool unmerged;
  _Bool mutex;
  _Bool extents;
  _Bool hpa;
  _Bool merged;
  emitter_t emitter;
  size_t u64sz;
  uint64_t epoch;
  
  epoch = 1;
  u64sz = 8;
  iVar2 = duckdb_je_mallctl("epoch",&epoch,&u64sz,&epoch,8);
  if (iVar2 == 0xb) {
    duckdb_je_malloc_write("<jemalloc>: Memory allocation failure in mallctl(\"epoch\", ...)\n");
    return;
  }
  if (iVar2 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", ...)\n");
    abort();
  }
  if (opts != (char *)0x0) {
    iVar2 = 0;
    bVar5 = true;
    merged = true;
    destroyed = true;
    unmerged = true;
    bins = true;
    large = true;
    mutex = true;
    extents = true;
    hpa = true;
    uVar3 = 0;
    do {
      cVar1 = opts[uVar3];
      switch(cVar1) {
      case 'a':
        unmerged = false;
        break;
      case 'b':
        bins = false;
        break;
      case 'c':
      case 'f':
      case 'i':
      case 'j':
      case 'k':
        break;
      case 'd':
        destroyed = false;
        break;
      case 'e':
        extents = false;
        break;
      case 'g':
        bVar5 = false;
        break;
      case 'h':
        hpa = false;
        break;
      case 'l':
        large = false;
        break;
      case 'm':
        merged = false;
        break;
      default:
        if (cVar1 == 'J') {
          iVar2 = 1;
        }
        else if (cVar1 == 'x') {
          mutex = false;
        }
        else if (cVar1 == '\0') goto LAB_01e980fd;
      }
      uVar3 = uVar3 + 1;
    } while( true );
  }
  bVar5 = true;
  emitter.output = emitter_output_table;
  merged = true;
  destroyed = true;
  unmerged = true;
  bins = true;
  large = true;
  mutex = true;
  extents = true;
  hpa = true;
LAB_01e98108:
  emitter.item_at_depth = false;
  emitter.emitted_key = false;
  emitter.nesting_depth = 0;
  emitter.write_cb = write_cb;
  emitter.cbopaque = cbopaque;
  if (emitter.output < emitter_output_table) {
    emitter_printf(&emitter,"{");
    emitter.nesting_depth = 1;
    emitter._28_2_ = emitter._28_2_ & 0xff00;
  }
  else {
    emitter_printf(&emitter,"%s",anon_var_dwarf_4b0ffdd + 9);
  }
  emitter_table_printf(&emitter,"___ Begin jemalloc statistics ___\n");
  emitter_json_object_kv_begin(&emitter,"jemalloc");
  if (bVar5) {
    stats_general_print(&emitter);
  }
  stats_print_helper(&emitter,merged,destroyed,unmerged,bins,large,mutex,extents,hpa);
  emitter_json_object_end(&emitter);
  emitter_table_printf(&emitter,"--- End jemalloc statistics ---\n");
  if (emitter.output < emitter_output_table) {
    emitter.nesting_depth = emitter.nesting_depth + -1;
    emitter.item_at_depth = true;
    pcVar4 = "\n}\n";
    if (emitter.output == emitter_output_json_compact) {
      pcVar4 = "}";
    }
    emitter_printf(&emitter,"%s",pcVar4);
  }
  return;
LAB_01e980fd:
  emitter.output = emitter_output_table - iVar2;
  goto LAB_01e98108;
}

Assistant:

void
stats_print(write_cb_t *write_cb, void *cbopaque, const char *opts) {
	int err;
	uint64_t epoch;
	size_t u64sz;
#define OPTION(o, v, d, s) bool v = d;
	STATS_PRINT_OPTIONS
#undef OPTION

	/*
	 * Refresh stats, in case mallctl() was called by the application.
	 *
	 * Check for OOM here, since refreshing the ctl cache can trigger
	 * allocation.  In practice, none of the subsequent mallctl()-related
	 * calls in this function will cause OOM if this one succeeds.
	 * */
	epoch = 1;
	u64sz = sizeof(uint64_t);
	err = je_mallctl("epoch", (void *)&epoch, &u64sz, (void *)&epoch,
	    sizeof(uint64_t));
	if (err != 0) {
		if (err == EAGAIN) {
			malloc_write("<jemalloc>: Memory allocation failure in "
			    "mallctl(\"epoch\", ...)\n");
			return;
		}
		malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", "
		    "...)\n");
		abort();
	}

	if (opts != NULL) {
		for (unsigned i = 0; opts[i] != '\0'; i++) {
			switch (opts[i]) {
#define OPTION(o, v, d, s) case o: v = s; break;
				STATS_PRINT_OPTIONS
#undef OPTION
			default:;
			}
		}
	}

	emitter_t emitter;
	emitter_init(&emitter,
	    json ? emitter_output_json_compact : emitter_output_table,
	    write_cb, cbopaque);
	emitter_begin(&emitter);
	emitter_table_printf(&emitter, "___ Begin jemalloc statistics ___\n");
	emitter_json_object_kv_begin(&emitter, "jemalloc");

	if (general) {
		stats_general_print(&emitter);
	}
	if (config_stats) {
		stats_print_helper(&emitter, merged, destroyed, unmerged,
		    bins, large, mutex, extents, hpa);
	}

	emitter_json_object_end(&emitter); /* Closes the "jemalloc" dict. */
	emitter_table_printf(&emitter, "--- End jemalloc statistics ---\n");
	emitter_end(&emitter);
}